

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.h
# Opt level: O1

void compute_sorted_huffman(Codebook *c,uint8 *lengths,uint32 *values)

{
  uint uVar1;
  uint8 uVar2;
  uint8 uVar3;
  uint32 *puVar4;
  uint32 *puVar5;
  uint uVar6;
  uint uVar7;
  long lVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  long lVar12;
  int *piVar13;
  
  if (c->sparse == '\0') {
    if (0 < c->entries) {
      lVar8 = 0;
      iVar10 = 0;
      do {
        if (0xb < (byte)(lengths[lVar8] + 1)) {
          uVar11 = c->codewords[lVar8];
          uVar11 = uVar11 >> 0x18 | (uVar11 & 0xff0000) >> 8 | (uVar11 & 0xff00) << 8 |
                   uVar11 << 0x18;
          uVar11 = (uVar11 & 0xf0f0f0f) << 4 | uVar11 >> 4 & 0xf0f0f0f;
          uVar11 = (uVar11 >> 2 & 0x33333333) + (uVar11 & 0x33333333) * 4;
          lVar12 = (long)iVar10;
          iVar10 = iVar10 + 1;
          c->sorted_codewords[lVar12] = (uVar11 >> 1 & 0x55555555) + (uVar11 & 0x55555555) * 2;
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 < c->entries);
    }
  }
  else if (0 < c->sorted_entries) {
    puVar4 = c->codewords;
    puVar5 = c->sorted_codewords;
    lVar8 = 0;
    do {
      uVar11 = puVar4[lVar8];
      uVar11 = uVar11 >> 0x18 | (uVar11 & 0xff0000) >> 8 | (uVar11 & 0xff00) << 8 | uVar11 << 0x18;
      uVar11 = (uVar11 & 0xf0f0f0f) << 4 | uVar11 >> 4 & 0xf0f0f0f;
      uVar11 = (uVar11 >> 2 & 0x33333333) + (uVar11 & 0x33333333) * 4;
      puVar5[lVar8] = (uVar11 >> 1 & 0x55555555) + (uVar11 & 0x55555555) * 2;
      lVar8 = lVar8 + 1;
    } while (lVar8 < c->sorted_entries);
  }
  SDL_qsort(c->sorted_codewords,(long)c->sorted_entries,4,uint32_compare);
  c->sorted_codewords[c->sorted_entries] = 0xffffffff;
  piVar13 = &c->sorted_entries;
  if (c->sparse == '\0') {
    piVar13 = &c->entries;
  }
  iVar10 = *piVar13;
  if (0 < (long)iVar10) {
    lVar8 = 0;
    do {
      uVar2 = c->sparse;
      uVar11 = (uint)lVar8;
      if (uVar2 != '\0') {
        uVar11 = values[lVar8];
      }
      uVar3 = lengths[uVar11];
      if ((uVar2 != '\0') || (0xb < (byte)(uVar3 + 1))) {
        uVar11 = c->sorted_entries;
        if ((int)uVar11 < 2) {
          uVar7 = 0;
        }
        else {
          uVar7 = c->codewords[lVar8];
          uVar7 = uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 | uVar7 << 0x18;
          uVar7 = (uVar7 & 0xf0f0f0f) << 4 | uVar7 >> 4 & 0xf0f0f0f;
          uVar1 = (uVar7 >> 2 & 0x33333333) + (uVar7 & 0x33333333) * 4;
          uVar7 = 0;
          do {
            uVar9 = uVar11 >> 1;
            uVar6 = uVar9;
            if (c->sorted_codewords[uVar7 + uVar9] <=
                (uVar1 >> 1 & 0x55555555) + (uVar1 & 0x55555555) * 2) {
              uVar6 = uVar11 - uVar9;
              uVar7 = uVar7 + uVar9;
            }
            uVar11 = uVar6;
          } while (1 < (int)uVar11);
        }
        if (uVar2 == '\0') {
          c->sorted_values[uVar7] = (uint)lVar8;
        }
        else {
          c->sorted_values[uVar7] = values[lVar8];
          c->codeword_lengths[uVar7] = uVar3;
        }
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 != iVar10);
  }
  return;
}

Assistant:

static void compute_sorted_huffman(Codebook *c, uint8 *lengths, uint32 *values)
{
   int i, len;
   // build a list of all the entries
   // OPTIMIZATION: don't include the short ones, since they'll be caught by FAST_HUFFMAN.
   // this is kind of a frivolous optimization--I don't see any performance improvement,
   // but it's like 4 extra lines of code, so.
   if (!c->sparse) {
      int k = 0;
      for (i=0; i < c->entries; ++i)
         if (include_in_sort(c, lengths[i]))
            c->sorted_codewords[k++] = bit_reverse(c->codewords[i]);
      assert(k == c->sorted_entries);
   } else {
      for (i=0; i < c->sorted_entries; ++i)
         c->sorted_codewords[i] = bit_reverse(c->codewords[i]);
   }

   qsort(c->sorted_codewords, c->sorted_entries, sizeof(c->sorted_codewords[0]), uint32_compare);
   c->sorted_codewords[c->sorted_entries] = 0xffffffff;

   len = c->sparse ? c->sorted_entries : c->entries;
   // now we need to indicate how they correspond; we could either
   //   #1: sort a different data structure that says who they correspond to
   //   #2: for each sorted entry, search the original list to find who corresponds
   //   #3: for each original entry, find the sorted entry
   // #1 requires extra storage, #2 is slow, #3 can use binary search!
   for (i=0; i < len; ++i) {
      int huff_len = c->sparse ? lengths[values[i]] : lengths[i];
      if (include_in_sort(c,huff_len)) {
         uint32 code = bit_reverse(c->codewords[i]);
         int x=0, n=c->sorted_entries;
         while (n > 1) {
            // invariant: sc[x] <= code < sc[x+n]
            int m = x + (n >> 1);
            if (c->sorted_codewords[m] <= code) {
               x = m;
               n -= (n>>1);
            } else {
               n >>= 1;
            }
         }
         assert(c->sorted_codewords[x] == code);
         if (c->sparse) {
            c->sorted_values[x] = values[i];
            c->codeword_lengths[x] = huff_len;
         } else {
            c->sorted_values[x] = i;
         }
      }
   }
}